

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLScanner::scanComment(XMLScanner *this)

{
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  bool bVar3;
  XMLCh XVar4;
  uint toFormat;
  XMLBuffer *this_00;
  XMLSize_t XVar5;
  UnexpectedEOFException *this_01;
  int iVar6;
  XMLBufBid bbComment;
  XMLCh tmpBuf [9];
  XMLCh local_48 [12];
  
  this_00 = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
  bVar2 = false;
  do {
    iVar6 = 0;
    do {
      while( true ) {
        XVar4 = ReaderMgr::getNextChar(&this->fReaderMgr);
        toFormat = (uint)(ushort)XVar4;
        if (XVar4 == L'\0') {
          emitError(this,UnterminatedComment);
          this_01 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
                     ,0x868,Gen_UnexpectedEOF,this->fMemoryManager);
          __cxa_throw(this_01,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
        }
        if ((toFormat & 0xfc00) == 0xd800) {
          bVar3 = true;
          if (bVar2) {
            emitError(this,Expected2ndSurrogateChar);
            bVar3 = bVar2;
          }
        }
        else {
          if (bVar2) {
            if ((toFormat + 0x2000 & 0xffff) < 0xfc00) {
              emitError(this,Expected2ndSurrogateChar);
            }
          }
          else if ((((this->fReaderMgr).fCurReader)->fgCharCharsTable[toFormat] & 0x40) == 0) {
            XMLString::binToText(toFormat,local_48,8,0x10,this->fMemoryManager);
            emitError(this,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          bVar3 = false;
        }
        bVar2 = bVar3;
        if (iVar6 == 0) break;
        if (iVar6 != 1) {
          if (XVar4 != L'>') {
            emitError(this,IllegalSequenceInComment);
            goto LAB_002bfbb2;
          }
          pXVar1 = this->fDocHandler;
          if (pXVar1 != (XMLDocumentHandler *)0x0) {
            this_00->fBuffer[this_00->fIndex] = L'\0';
            (*pXVar1->_vptr_XMLDocumentHandler[3])();
          }
          XVar5 = (this->fElemStack).fStackTop;
          if (XVar5 != 0) {
            (this->fElemStack).fStack[XVar5 - 1]->fCommentOrPISeen = true;
          }
          goto LAB_002bfbc7;
        }
        iVar6 = 2;
        if (XVar4 != L'-') {
          XVar5 = this_00->fIndex;
          if (XVar5 == this_00->fCapacity) {
            XMLBuffer::ensureCapacity(this_00,1);
            XVar5 = this_00->fIndex;
          }
          this_00->fIndex = XVar5 + 1;
          this_00->fBuffer[XVar5] = L'-';
          XVar5 = this_00->fIndex;
          if (XVar5 != this_00->fCapacity) goto LAB_002bfb40;
          XMLBuffer::ensureCapacity(this_00,1);
          goto LAB_002bfb3c;
        }
      }
      iVar6 = 1;
    } while (XVar4 == L'-');
    XVar5 = this_00->fIndex;
    if (XVar5 == this_00->fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
LAB_002bfb3c:
      XVar5 = this_00->fIndex;
    }
LAB_002bfb40:
    this_00->fIndex = XVar5 + 1;
    this_00->fBuffer[XVar5] = XVar4;
  } while( true );
  while (XVar4 != L'>') {
LAB_002bfbb2:
    XVar4 = ReaderMgr::getNextChar(&this->fReaderMgr);
    if (XVar4 == L'\0') break;
  }
LAB_002bfbc7:
  XMLBufferMgr::releaseBuffer(&this->fBufMgr,this_00);
  return;
}

Assistant:

void XMLScanner::scanComment()
{

    enum States
    {
        InText
        , OneDash
        , TwoDashes
    };

    // Get a buffer for this
    XMLBufBid bbComment(&fBufMgr);

    //  Get the comment text into a temp buffer. Be sure to use temp buffer
    //  two here, since its to be used for stuff that is potentially longer
    //  than just a name.
    States curState = InText;
    bool gotLeadingSurrogate = false;
    while (true)
    {
        // Get the next character
        const XMLCh nextCh = fReaderMgr.getNextChar();

        //  Watch for an end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedComment);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        // Check for correct surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            if (gotLeadingSurrogate)
                emitError(XMLErrs::Expected2ndSurrogateChar);
            else
                gotLeadingSurrogate = true;
        }
        else
        {
            if (gotLeadingSurrogate)
            {
                if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
                    emitError(XMLErrs::Expected2ndSurrogateChar);
            }
            // Its got to at least be a valid XML character
            else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh)) {

                XMLCh tmpBuf[9];
                XMLString::binToText
                (
                    nextCh
                    , tmpBuf
                    , 8
                    , 16
                    , fMemoryManager
                );
                emitError(XMLErrs::InvalidCharacter, tmpBuf);
            }

            gotLeadingSurrogate = false;
        }

        if (curState == InText)
        {
            // If its a dash, go to OneDash state. Otherwise take as text
            if (nextCh == chDash)
                curState = OneDash;
            else
                bbComment.append(nextCh);
        }
        else if (curState == OneDash)
        {
            //  If its another dash, then we change to the two dashes states.
            //  Otherwise, we have to put in the deficit dash and the new
            //  character and go back to InText.
            if (nextCh == chDash)
            {
                curState = TwoDashes;
            }
            else
            {
                bbComment.append(chDash);
                bbComment.append(nextCh);
                curState = InText;
            }
        }
        else if (curState == TwoDashes)
        {
            // The next character must be the closing bracket
            if (nextCh != chCloseAngle)
            {
                emitError(XMLErrs::IllegalSequenceInComment);
                fReaderMgr.skipPastChar(chCloseAngle);
                return;
            }
            break;
        }
    }

    // If we have an available handler, call back with the comment.
    if (fDocHandler)
    {
        fDocHandler->docComment
        (
            bbComment.getRawBuffer()
        );
    }

    //mark comment is seen within the current element
    if (! fElemStack.isEmpty())
        fElemStack.setCommentOrPISeen();

}